

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CNFOnTheFly.cpp
# Opt level: O0

InferenceRule Inferences::convert(Proxy cnst)

{
  Proxy cnst_local;
  InferenceRule local_1;
  
  switch(cnst) {
  case NOT:
    local_1 = HOL_NOT_ELIMINATION;
    break;
  case PI:
    local_1 = VPI_ELIMINATION;
    break;
  case SIGMA:
    local_1 = VSIGMA_ELIMINATION;
    break;
  case EQUALS:
    local_1 = HOL_EQUALITY_ELIMINATION;
    break;
  default:
    local_1 = BINARY_CONN_ELIMINATION;
  }
  return local_1;
}

Assistant:

InferenceRule convert(Signature::Proxy cnst){
  switch(cnst){
    case Signature::PI:
      return InferenceRule::VPI_ELIMINATION;
    case Signature::SIGMA:
      return InferenceRule::VSIGMA_ELIMINATION;
    case Signature::EQUALS:
      return InferenceRule::HOL_EQUALITY_ELIMINATION;
    case Signature::NOT:
      return InferenceRule::HOL_NOT_ELIMINATION;
    default:
      return InferenceRule::BINARY_CONN_ELIMINATION;   
  }
}